

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O3

void __thiscall cppcms::cache_interface::store_page(cache_interface *this,string *key,int timeout)

{
  base_cache *pbVar1;
  response *prVar2;
  char *__lhs;
  string r_key;
  time_t tmp;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  if (((this->cache_module_).p_ != (base_cache *)0x0) && (this->context_ != (context *)0x0)) {
    prVar2 = http::context::response(this->context_);
    http::response::finalize(prVar2);
    __lhs = "_Z:";
    if ((this->field_0x78 & 1) == 0) {
      __lhs = "_U:";
    }
    std::operator+(&local_48,__lhs,key);
    add_trigger(this,key);
    pbVar1 = (this->cache_module_).p_;
    prVar2 = http::context::response(this->context_);
    http::response::copied_data_abi_cxx11_(&local_68,prVar2);
    if (timeout < 0) {
      local_28 = 0x7ffffffffffeae7f;
    }
    else {
      time(&local_28);
      local_28 = (ulong)(uint)timeout + local_28;
    }
    (*pbVar1->_vptr_base_cache[1])(pbVar1,&local_48,&local_68,&this->triggers_,local_28,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

bool cache_interface::nocache()
{
	return cache_module_.get()==0;
}